

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool considerScaling(HighsOptions *options,HighsLp *lp)

{
  bool bVar1;
  int *in_RSI;
  long in_RDI;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  bool analyse_lp_data;
  bool try_scaling;
  bool new_scaling_strategy;
  bool scaling_not_tried;
  bool allow_scaling;
  bool new_scaling;
  bool in_stack_00000087;
  HighsLp *in_stack_00000088;
  HighsOptions *in_stack_00000090;
  HighsLp *in_stack_00000358;
  HighsLogOptions *in_stack_00000360;
  byte in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  undefined1 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe5;
  byte bVar5;
  bool local_1;
  
  bVar5 = 0;
  bVar2 = false;
  if (0 < *in_RSI) {
    bVar2 = *(int *)(in_RDI + 0x168) != 0;
  }
  if (((*(byte *)(in_RSI + 0x83) & 1) == 0) || (bVar2)) {
    bVar3 = false;
    if (*(int *)(in_RDI + 0x168) != in_RSI[0x82]) {
      bVar3 = *(int *)(in_RDI + 0x168) != 1;
    }
    bVar1 = false;
    if ((bVar2) && (bVar1 = true, in_RSI[0x82] != 0)) {
      bVar1 = bVar3;
    }
    if (bVar1) {
      HighsLp::unapplyScale(lp);
      bVar4 = (*(uint *)(in_RDI + 0x160) & 1) != 0;
      if ((bool)bVar4) {
        analyseLp(in_stack_00000360,in_stack_00000358);
      }
      scaleLp(in_stack_00000090,in_stack_00000088,in_stack_00000087);
      bVar5 = *(byte *)(in_RSI + 0x94) & 1;
      if (((bVar4 & 1) != 0) && ((*(byte *)(in_RSI + 0x94) & 1) != 0)) {
        analyseLp(in_stack_00000360,in_stack_00000358);
      }
    }
    else if ((*(byte *)(in_RSI + 0x83) & 1) != 0) {
      HighsLp::applyScale(lp);
    }
    local_1 = (bool)(bVar5 & 1);
  }
  else {
    HighsLp::clearScale((HighsLp *)
                        (ulong)CONCAT15(in_stack_ffffffffffffffe5,
                                        CONCAT14(in_stack_ffffffffffffffe4,
                                                 CONCAT13(in_stack_ffffffffffffffe3,
                                                          CONCAT12(in_stack_ffffffffffffffe2,
                                                                   (ushort)in_stack_ffffffffffffffe0
                                                                  )))));
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool considerScaling(const HighsOptions& options, HighsLp& lp) {
  // Indicate whether new scaling has been determined in the return value.
  bool new_scaling = false;
  // Consider scaling the LP - either by finding new factors or by
  // applying any existing factors
  const bool allow_scaling =
      lp.num_col_ > 0 &&
      options.simplex_scale_strategy != kSimplexScaleStrategyOff;
  if (lp.scale_.has_scaling && !allow_scaling) {
    // LP had scaling before, but now it is not permitted, clear any
    // scaling. Return true as scaling position has changed
    lp.clearScale();
    return true;
  }
  const bool scaling_not_tried = lp.scale_.strategy == kSimplexScaleStrategyOff;
  const bool new_scaling_strategy =
      options.simplex_scale_strategy != lp.scale_.strategy &&
      options.simplex_scale_strategy != kSimplexScaleStrategyChoose;
  const bool try_scaling =
      allow_scaling && (scaling_not_tried || new_scaling_strategy);
  if (try_scaling) {
    // Scaling will be tried, so ensure that any previous scaling is not applied
    lp.unapplyScale();
    const bool analyse_lp_data =
        kHighsAnalysisLevelModelData & options.highs_analysis_level;
    if (analyse_lp_data) analyseLp(options.log_options, lp);
    scaleLp(options, lp);
    // If the LP is now scaled, then the scaling is new
    new_scaling = lp.is_scaled_;
    if (analyse_lp_data && lp.is_scaled_) analyseLp(options.log_options, lp);
  } else if (lp.scale_.has_scaling) {
    // Scaling factors are known, so ensure that they are applied
    lp.applyScale();
  }
  // Ensure that either the LP has scale factors and is scaled, or
  // it doesn't have scale factors and isn't scaled
  assert(lp.scale_.has_scaling == lp.is_scaled_);
  return new_scaling;
}